

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,float *fdtbl,int DC,
              unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  float *d0p;
  int iVar7;
  uint uVar8;
  int iVar9;
  unsigned_short bits [2];
  unsigned_short M16zeroes [2];
  unsigned_short EOB [2];
  int startpos;
  int DU [64];
  
  EOB[0] = (*HTAC)[0];
  EOB[1] = (*HTAC)[1];
  M16zeroes[0] = HTAC[0xf0][0];
  M16zeroes[1] = HTAC[0xf0][1];
  uVar4 = 0xfffffffffffffff8;
  d0p = CDU;
  do {
    stbiw__jpg_DCT(d0p,d0p + 1,d0p + 2,d0p + 3,d0p + 4,d0p + 5,d0p + 6,d0p + 7);
    uVar4 = uVar4 + 8;
    d0p = d0p + 8;
  } while (uVar4 < 0x38);
  lVar5 = 0;
  do {
    stbiw__jpg_DCT((float *)(lVar5 + (long)CDU),(float *)((long)CDU + lVar5 + 0x20),
                   (float *)((long)CDU + lVar5 + 0x40),(float *)((long)CDU + lVar5 + 0x60),
                   (float *)((long)CDU + lVar5 + 0x80),(float *)((long)CDU + lVar5 + 0xa0),
                   (float *)((long)CDU + lVar5 + 0xc0),(float *)((long)CDU + lVar5 + 0xe0));
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x20);
  lVar5 = 0;
  do {
    DU[""[lVar5]] =
         (int)(CDU[lVar5] * fdtbl[lVar5] +
              *(float *)(&DAT_001dbebc + (ulong)(CDU[lVar5] * fdtbl[lVar5] < 0.0) * 4));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x40);
  uVar2 = DU[0] - DC;
  if (uVar2 != 0) {
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar8 = 1;
    if (1 < uVar3) {
      uVar8 = (uVar1 ^ 0xffffffe0) + 0x21;
    }
    bits[1] = (unsigned_short)uVar8;
    bits[0] = ~(ushort)(-1 << ((byte)uVar8 & 0x1f)) & (short)((int)uVar2 >> 0x1f) + (short)uVar2;
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[uVar8 & 0xff]);
    HTDC = &bits;
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  uVar2 = 0x40;
  do {
    uVar4 = (ulong)(uVar2 - 1);
    if (DU[uVar4] != 0) goto LAB_00138df0;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  uVar4 = 0;
LAB_00138df0:
  iVar7 = (int)uVar4;
  if (iVar7 != 0) {
    if (0 < iVar7) {
      iVar6 = 1;
      do {
        lVar5 = (long)iVar6;
        uVar3 = 0xffffffff;
        uVar2 = 0;
        do {
          uVar8 = uVar2;
          uVar1 = DU[lVar5];
          uVar3 = uVar3 + 1;
          if ((long)uVar4 < lVar5) break;
          lVar5 = lVar5 + 1;
          uVar2 = uVar8 + 1;
        } while (uVar1 == 0);
        uVar2 = uVar3;
        if (0xf < (int)uVar3) {
          uVar8 = uVar8 >> 4;
          iVar9 = uVar8 + (uVar8 == 0);
          do {
            stbiw__jpg_writeBits(s,bitBuf,bitCnt,M16zeroes);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
          uVar2 = uVar3 & 0xf;
        }
        uVar8 = -uVar1;
        if (0 < (int)uVar1) {
          uVar8 = uVar1;
        }
        iVar9 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        bits[1] = ((ushort)iVar9 ^ 0xffe0) + 0x21;
        if (uVar8 < 2) {
          bits[1] = 1;
        }
        iVar9 = uVar3 + iVar6;
        bits[0] = ~(ushort)(-1 << ((byte)bits[1] & 0x1f)) &
                  (short)((int)uVar1 >> 0x1f) + (short)uVar1;
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTAC[(int)(uVar2 * 0x10 + (uint)(byte)bits[1])]);
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,bits);
        iVar6 = iVar6 + uVar3 + 1;
      } while (iVar9 < iVar7);
    }
    if (iVar7 == 0x3f) {
      return DU[0];
    }
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,EOB);
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, diff, end0pos;
   int DU[64];

   // DCT rows
   for(dataOff=0; dataOff<64; dataOff+=8) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+8], &CDU[dataOff+16], &CDU[dataOff+24], &CDU[dataOff+32], &CDU[dataOff+40], &CDU[dataOff+48], &CDU[dataOff+56]);
   }
   // Quantize/descale/zigzag the coefficients
   for(i=0; i<64; ++i) {
      float v = CDU[i]*fdtbl[i];
      // DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
      // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
      DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}